

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Expression * __thiscall slang::ast::PortSymbol::getInitializer(PortSymbol *this)

{
  Type *this_00;
  Scope *pSVar1;
  Symbol *in_RDI;
  LookupLocation LVar2;
  ASTContext context;
  PortSymbol *in_stack_000000d8;
  LookupLocation ll;
  Scope *scope;
  Expression *in_stack_00000268;
  ASTContext *in_stack_00000270;
  bitmask<slang::ast::EvalFlags> in_stack_0000027f;
  Symbol *in_stack_fffffffffffffed0;
  int delta;
  ASTContext *in_stack_fffffffffffffed8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffee0;
  Scope *in_stack_fffffffffffffee8;
  bitmask<slang::ast::EvalFlags> local_101 [41];
  bitmask<slang::ast::ASTFlags> local_d8;
  SourceLocation local_d0;
  SourceLocation local_c8;
  SourceRange local_c0;
  underlying_type local_b0;
  Scope *local_a8;
  undefined8 local_a0;
  ASTContext *in_stack_ffffffffffffff70;
  ExpressionSyntax *in_stack_ffffffffffffff78;
  Type *in_stack_ffffffffffffff80;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff88;
  SourceRange in_stack_ffffffffffffff90;
  LookupLocation local_20;
  Scope *local_10;
  
  if ((in_RDI[1].parentScope == (Scope *)0x0) && (*(long *)&in_RDI[1].indexInScope != 0)) {
    local_10 = Symbol::getParentScope(in_RDI);
    LookupLocation::LookupLocation(&local_20);
    if (((ulong)in_RDI[1].name._M_str & 0x10000000000) == 0) {
      LVar2 = LookupLocation::after(in_stack_fffffffffffffed0);
      local_20.scope = LVar2.scope;
      local_20.index = LVar2.index;
    }
    else {
      LVar2 = LookupLocation::after(in_stack_fffffffffffffed0);
      local_20.scope = LVar2.scope;
      local_20.index = LVar2.index;
    }
    local_a8 = local_20.scope;
    local_a0 = CONCAT44(local_20._12_4_,local_20.index);
    pSVar1 = local_10;
    local_b0 = (underlying_type)
               ast::operator|((ASTFlags)in_stack_fffffffffffffed8,(ASTFlags)local_10);
    LVar2._8_8_ = in_RDI;
    LVar2.scope = in_stack_fffffffffffffee8;
    ASTContext::ASTContext(in_stack_fffffffffffffed8,pSVar1,LVar2,in_stack_fffffffffffffee0);
    delta = (int)((ulong)pSVar1 >> 0x20);
    this_00 = getType(in_stack_000000d8);
    local_c8 = (SourceLocation)in_RDI[1].originatingSyntax;
    local_d0 = SourceLocation::operator+<int>((SourceLocation *)this_00,delta);
    SourceRange::SourceRange(&local_c0,local_c8,local_d0);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_d8,None);
    pSVar1 = (Scope *)Expression::bindRValue
                                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff70,
                                 in_stack_ffffffffffffff88);
    in_RDI[1].parentScope = pSVar1;
    memset(local_101,0,1);
    bitmask<slang::ast::EvalFlags>::bitmask(local_101);
    ASTContext::eval(in_stack_00000270,in_stack_00000268,in_stack_0000027f);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x1078bee);
  }
  return (Expression *)in_RDI[1].parentScope;
}

Assistant:

const Expression* PortSymbol::getInitializer() const {
    if (!initializer && initializerSyntax) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);
        SLANG_ASSERT(internalSymbol);

        // Ansi ports bind their initializers in the context of the port list,
        // while non-ansi ports use the internal symbol context.
        LookupLocation ll;
        if (isAnsiPort)
            ll = LookupLocation::after(*this);
        else
            ll = LookupLocation::after(*internalSymbol);

        ASTContext context(*scope, ll, ASTFlags::NonProcedural | ASTFlags::StaticInitializer);
        initializer = &Expression::bindRValue(getType(), *initializerSyntax,
                                              {initializerLoc, initializerLoc + 1}, context);
        context.eval(*initializer);
    }

    return initializer;
}